

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void r_object_collection(xr_packet *packet)

{
  uint16_t uVar1;
  xr_packet *packet_local;
  
  uVar1 = xray_re::xr_packet::r_u16(packet);
  if (uVar1 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x18,"void r_object_collection(xr_packet &)");
  }
  uVar1 = xray_re::xr_packet::r_u16(packet);
  if (uVar1 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x1a,"void r_object_collection(xr_packet &)");
  }
  uVar1 = xray_re::xr_packet::r_u16(packet);
  if (uVar1 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x1c,"void r_object_collection(xr_packet &)");
  }
  uVar1 = xray_re::xr_packet::r_u16(packet);
  if (uVar1 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0x1e,"void r_object_collection(xr_packet &)");
  }
  return;
}

Assistant:

static void r_object_collection(xr_packet& packet)
{
	if (packet.r_u16())		// m_count
		xr_not_implemented();
	if (packet.r_u16())		// m_last_id
		xr_not_implemented();
	if (packet.r_u16())		// m_free
		xr_not_implemented();
	if (packet.r_u16())		// m_given
		xr_not_implemented();
}